

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void q_createNativeChildrenAndSetParent(QWidget *parentWidget)

{
  QWidgetData **ppQVar1;
  long lVar2;
  QArrayData *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  long lVar7;
  long lVar8;
  QWindow *pQVar9;
  long lVar10;
  
  lVar2 = *(long *)&parentWidget->field_0x8;
  pQVar3 = *(QArrayData **)(lVar2 + 0x18);
  lVar4 = *(long *)(lVar2 + 0x20);
  lVar2 = *(long *)(lVar2 + 0x28);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 != 0) {
    lVar10 = 0;
    do {
      if (((*(byte *)(*(long *)(*(long *)(lVar4 + lVar10 * 8) + 8) + 0x30) & 1) != 0) &&
         (pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QWidget::staticMetaObject),
         pQVar6 != (QWidget *)0x0)) {
        if ((*(byte *)(*(long *)&pQVar6->field_0x8 + 0x248) & 0x10) == 0) {
          q_createNativeChildrenAndSetParent(pQVar6);
        }
        else {
          if (pQVar6->data->winid == 0) {
            QWidget::winId(pQVar6);
          }
          lVar7 = *(long *)(*(long *)&pQVar6->field_0x8 + 0x78);
          if (lVar7 == 0) {
            lVar8 = 0;
          }
          else {
            lVar8 = *(long *)(lVar7 + 8);
          }
          if ((lVar8 != 0) && (*(long *)(lVar8 + 0x20) != 0)) {
            if (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
              if (lVar7 == 0) {
                lVar7 = 0;
              }
              else {
                lVar7 = *(long *)(lVar7 + 8);
              }
              if (lVar7 == 0) {
                pQVar9 = (QWindow *)0x0;
              }
              else {
                pQVar9 = *(QWindow **)(lVar7 + 0x20);
              }
              do {
                pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
                if (pQVar6 == (QWidget *)0x0) break;
              } while (pQVar6->data->winid == 0);
              QWindow::setParent(pQVar9);
            }
            else {
              if (lVar7 == 0) {
                lVar7 = 0;
              }
              else {
                lVar7 = *(long *)(lVar7 + 8);
              }
              pQVar6 = parentWidget;
              if (lVar7 == 0) {
                pQVar9 = (QWindow *)0x0;
              }
              else {
                pQVar9 = *(QWindow **)(lVar7 + 0x20);
              }
              do {
                pQVar5 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
                if (pQVar5 == (QWidget *)0x0) break;
                ppQVar1 = &pQVar6->data;
                pQVar6 = pQVar5;
              } while ((((*ppQVar1)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
              QWindow::setTransientParent(pQVar9);
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar2);
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

void q_createNativeChildrenAndSetParent(const QWidget *parentWidget)
{
    QObjectList children = parentWidget->children();
    for (int i = 0; i < children.size(); i++) {
        if (children.at(i)->isWidgetType()) {
            const QWidget *childWidget = qobject_cast<const QWidget *>(children.at(i));
            if (childWidget) { // should not be necessary
                if (childWidget->testAttribute(Qt::WA_NativeWindow)) {
                    if (!childWidget->internalWinId())
                        childWidget->winId();
                    if (childWidget->windowHandle()) {
                        if (childWidget->isWindow()) {
                            childWidget->windowHandle()->setTransientParent(parentWidget->window()->windowHandle());
                        } else {
                            childWidget->windowHandle()->setParent(childWidget->nativeParentWidget()->windowHandle());
                        }
                    }
                } else {
                    q_createNativeChildrenAndSetParent(childWidget);
                }
            }
        }
    }

}